

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-type.cpp
# Opt level: O3

Up __thiscall yactfr::FixedLengthUnsignedIntegerType::_clone(FixedLengthUnsignedIntegerType *this)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Var1;
  undefined4 local_54;
  DisplayBase local_50;
  BitOrder local_4c;
  ByteOrder local_48;
  uint local_44;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_40;
  _func_int **local_38;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_30;
  
  local_44 = *(uint *)(in_RSI + 0xc);
  local_48 = *(ByteOrder *)(in_RSI + 0x18);
  local_4c = *(BitOrder *)(in_RSI + 0x1c);
  local_50 = *(DisplayBase *)(in_RSI + 0x20);
  local_54 = *(undefined4 *)(in_RSI + 0x28);
  if (*(__fn **)(in_RSI + 0x10) == (__fn *)0x0) {
    _Var1._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)&stack0xffffffffffffffd0,*(__fn **)(in_RSI + 0x10),in_RDX,in_ECX,in_R8
                  );
    _Var1._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &stack0xffffffffffffffd0);
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       _Var1._M_head_impl;
  std::
  make_unique<yactfr::FixedLengthUnsignedIntegerType_const,unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,yactfr::DisplayBase,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,std::set<yactfr::UnsignedIntegerTypeRole,std::less<yactfr::UnsignedIntegerTypeRole>,std::allocator<yactfr::UnsignedIntegerTypeRole>>const&>
            ((uint *)&local_38,&local_44,&local_48,&local_4c,&local_50,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
              *)&stack0xffffffffffffffac,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (in_RSI + 0x30),
             (set<yactfr::UnsignedIntegerTypeRole,_std::less<yactfr::UnsignedIntegerTypeRole>,_std::allocator<yactfr::UnsignedIntegerTypeRole>_>
              *)&local_40);
  (this->super_FixedLengthIntegerType<unsigned_long_long>).super_FixedLengthBitArrayType.
  super_ScalarDataType.super_DataType._vptr_DataType = local_38;
  local_38 = (_func_int **)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_40);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthUnsignedIntegerType::_clone() const
{
    return FixedLengthUnsignedIntegerType::create(this->alignment(), this->length(),
                                                  this->byteOrder(), this->bitOrder(),
                                                  this->preferredDisplayBase(), this->mappings(),
                                                  internal::tryCloneAttrs(this->attributes()),
                                                  this->roles());
}